

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::ReadPixels::ReadPixels
          (ReadPixels *this,int x,int y,int width,int height,GLenum format,GLenum type,
          SharedPtr<tcu::ThreadUtil::DataBlock> *data,bool useSync,bool serverSync)

{
  DataBlock *this_00;
  SharedPtr<tcu::ThreadUtil::Event> local_50;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_40;
  
  Operation::Operation(&this->super_Operation,"ReadPixels",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation = (_func_int **)&PTR__ReadPixels_003d6200;
  this->m_x = x;
  this->m_y = y;
  this->m_width = width;
  this->m_height = height;
  this->m_format = format;
  this->m_type = type;
  (this->m_data).m_ptr = (DataBlock *)0x0;
  (this->m_data).m_state = (SharedPtrStateBase *)0x0;
  this_00 = (DataBlock *)operator_new(0x50);
  local_50.m_ptr = (this->super_Operation).super_Operation.m_event.m_ptr;
  local_50.m_state = (this->super_Operation).super_Operation.m_event.m_state;
  if (local_50.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_50.m_state)->strongRefCount = (local_50.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_50.m_state)->weakRefCount = (local_50.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  tcu::ThreadUtil::DataBlock::DataBlock(this_00,&local_50);
  de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr(&local_40,this_00);
  de::SharedPtr<tcu::ThreadUtil::DataBlock>::operator=(data,&local_40);
  de::SharedPtr<tcu::ThreadUtil::DataBlock>::release(&local_40);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_50);
  de::SharedPtr<tcu::ThreadUtil::DataBlock>::operator=(&this->m_data,data);
  return;
}

Assistant:

ReadPixels::ReadPixels (int x, int y, int width, int height, GLenum format, GLenum type, SharedPtr<tcu::ThreadUtil::DataBlock>& data, bool useSync, bool serverSync)
	: Operation	("ReadPixels", useSync, serverSync)
	, m_x		(x)
	, m_y		(y)
	, m_width	(width)
	, m_height	(height)
	, m_format	(format)
	, m_type	(type)
{
	data = SharedPtr<tcu::ThreadUtil::DataBlock>(new tcu::ThreadUtil::DataBlock(getEvent()));
	m_data = data;
}